

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicGroundCombatSoldier.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::operator==
          (GED_BasicGroundCombatSoldier *this,GED_BasicGroundCombatSoldier *Value)

{
  KBOOL KVar1;
  GED_BasicGroundCombatSoldier *Value_local;
  GED_BasicGroundCombatSoldier *this_local;
  
  if (this->m_ui16EntityID == Value->m_ui16EntityID) {
    if (this->m_i16Offsets[0] == Value->m_i16Offsets[0]) {
      if (this->m_i16Offsets[1] == Value->m_i16Offsets[1]) {
        if (this->m_i16Offsets[2] == Value->m_i16Offsets[2]) {
          KVar1 = DATA_TYPE::EntityAppearance::operator!=(&this->m_EA,&Value->m_EA);
          if (KVar1) {
            this_local._7_1_ = false;
          }
          else if (this->m_i8Ori[0] == Value->m_i8Ori[0]) {
            if (this->m_i8Ori[1] == Value->m_i8Ori[1]) {
              if (this->m_i8Ori[2] == Value->m_i8Ori[2]) {
                if (this->m_i8Spd == Value->m_i8Spd) {
                  if (this->m_i8HdAz == Value->m_i8HdAz) {
                    if (this->m_i8HdElv == Value->m_i8HdElv) {
                      if (this->m_i8HdScanRt == Value->m_i8HdScanRt) {
                        if (this->m_i8HdElvRt == Value->m_i8HdElvRt) {
                          this_local._7_1_ = true;
                        }
                        else {
                          this_local._7_1_ = false;
                        }
                      }
                      else {
                        this_local._7_1_ = false;
                      }
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL GED_BasicGroundCombatSoldier::operator == ( const GED_BasicGroundCombatSoldier & Value ) const
{
    if( m_ui16EntityID      != Value.m_ui16EntityID )   return false;
    if( m_i16Offsets[0]     != Value.m_i16Offsets[0] )  return false;
    if( m_i16Offsets[1]     != Value.m_i16Offsets[1] )  return false;
    if( m_i16Offsets[2]     != Value.m_i16Offsets[2] )  return false;
    if( m_EA                != Value.m_EA )             return false;
    if( m_i8Ori[0]          != Value.m_i8Ori[0] )       return false;
    if( m_i8Ori[1]          != Value.m_i8Ori[1] )       return false;
    if( m_i8Ori[2]          != Value.m_i8Ori[2] )       return false;
    if( m_i8Spd             != Value.m_i8Spd )          return false;
    if( m_i8HdAz            != Value.m_i8HdAz )         return false;
    if( m_i8HdElv           != Value.m_i8HdElv  )       return false;
    if( m_i8HdScanRt        != Value.m_i8HdScanRt )     return false;
    if( m_i8HdElvRt         != Value.m_i8HdElvRt )      return false;
    return true;
}